

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

RowSetEntry * rowSetEntrySort(RowSetEntry *pIn)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  long lVar3;
  ulong uVar4;
  RowSetEntry **ppRVar5;
  RowSetEntry *aBucket [40];
  RowSetEntry *local_168 [40];
  
  memset(local_168,0,0x140);
  if (pIn != (RowSetEntry *)0x0) {
    pRVar2 = (RowSetEntry *)0x0;
    do {
      pRVar1 = pIn->pRight;
      pIn->pRight = (RowSetEntry *)0x0;
      ppRVar5 = local_168;
      if (pRVar2 != (RowSetEntry *)0x0) {
        uVar4 = 1;
        ppRVar5 = local_168;
        do {
          pIn = rowSetEntryMerge(pRVar2,pIn);
          *ppRVar5 = (RowSetEntry *)0x0;
          ppRVar5 = local_168 + uVar4;
          pRVar2 = *ppRVar5;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (pRVar2 != (RowSetEntry *)0x0);
      }
      *ppRVar5 = pIn;
      pRVar2 = local_168[0];
      pIn = pRVar1;
    } while (pRVar1 != (RowSetEntry *)0x0);
  }
  lVar3 = 0;
  pRVar2 = (RowSetEntry *)0x0;
  do {
    pRVar2 = rowSetEntryMerge(pRVar2,local_168[lVar3]);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x28);
  return pRVar2;
}

Assistant:

static struct RowSetEntry *rowSetEntrySort(struct RowSetEntry *pIn){
  unsigned int i;
  struct RowSetEntry *pNext, *aBucket[40];

  memset(aBucket, 0, sizeof(aBucket));
  while( pIn ){
    pNext = pIn->pRight;
    pIn->pRight = 0;
    for(i=0; aBucket[i]; i++){
      pIn = rowSetEntryMerge(aBucket[i], pIn);
      aBucket[i] = 0;
    }
    aBucket[i] = pIn;
    pIn = pNext;
  }
  pIn = 0;
  for(i=0; i<sizeof(aBucket)/sizeof(aBucket[0]); i++){
    pIn = rowSetEntryMerge(pIn, aBucket[i]);
  }
  return pIn;
}